

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_memory_tracker.c
# Opt level: O2

void reflect_memory_tracker_debug(void)

{
  function_stats_debug();
  class_stats_debug();
  object_stats_debug();
  exception_stats_debug();
  return;
}

Assistant:

void reflect_memory_tracker_debug(void)
{
#if defined(REFLECT_MEMORY_TRACKER) && REFLECT_MEMORY_TRACKER == 1
	function_stats_debug();
	class_stats_debug();
	object_stats_debug();
	exception_stats_debug();
#endif
}